

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

bool __thiscall GameBoard::place(GameBoard *this,int id,int blockType,int x,int y,int o)

{
  vector<Tetris,_std::allocator<Tetris>_> *pvVar1;
  vector<Tetris,_std::allocator<Tetris>_> pl;
  vector<Tetris,_std::allocator<Tetris>_> local_28;
  
  local_28.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_28.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pvVar1 = getPlaces(this,id,blockType,&local_28,false);
  if (local_28.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(pvVar1);
}

Assistant:

int GameBoard::transfer()
{
    int color1 = 0, color2 = 1;
    if (transCount[color1] == 0 && transCount[color2] == 0)
        return -1;
    if (transCount[color1] == 0 || transCount[color2] == 0) {
        if (transCount[color1] == 0 && transCount[color2] > 0)
            swap(color1, color2);
        int h2;
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];
        if (h2 > MAPHEIGHT)
            return color2;
        int i, j;

        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];
        return -1;
    }
    else {
        int h1, h2;
        maxHeight[color1] = h1 = maxHeight[color1] + transCount[color2];//从color1处移动count1去color2
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];

        if (h1 > MAPHEIGHT)
            return color1;
        if (h2 > MAPHEIGHT)
            return color2;

        int i, j;
        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];

        for (i = h1; i > transCount[color2]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = gridInfo[color1][i - transCount[color2]][j];

        for (i = transCount[color2]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = trans[color2][i - 1][j];

        return -1;
    }
}